

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

matrix<double> * __thiscall mat_lib::matrix<double>::operator/=(matrix<double> *this,float scalar)

{
  size_t sVar1;
  size_t sVar2;
  element_t *peVar3;
  ostream *poVar4;
  invalid_argument *this_00;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  ostringstream str_stream;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  if ((scalar == 0.0) && (!NAN(scalar))) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"divide by zero! bad scalar provided (",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"operator/=",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"() in ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
               ,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x183);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(this_00,local_1b0);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar1 = this->rows__;
  if (sVar1 != 0) {
    sVar2 = this->columns__;
    peVar3 = this->elements__;
    sVar5 = 0;
    do {
      if (sVar2 != 0) {
        lVar6 = 0;
        sVar7 = sVar2;
        do {
          *(double *)((long)peVar3 + (lVar6 >> 0x1d) + sVar2 * sVar5 * 8) =
               *(double *)((long)peVar3 + (lVar6 >> 0x1d) + sVar2 * sVar5 * 8) / (double)scalar;
          lVar6 = lVar6 + 0x100000000;
          sVar7 = sVar7 - 1;
        } while (sVar7 != 0);
      }
      sVar5 = sVar5 + 1;
    } while (sVar5 != sVar1);
  }
  return this;
}

Assistant:

matrix<T>& matrix<T>::operator/=(float scalar)
  {
    if(scalar==0) 
    {
      ostringstream str_stream;
      str_stream<<"divide by zero! bad scalar provided ("
        <<__func__<<"() in "<<__FILE__<<":"<<__LINE__<<")";
      throw invalid_argument(str_stream.str());
    }
    for(size_t i=0; i<rows__; i++)
      for(size_t j=0; j<columns__; j++) elements__[offset__(i,j)]/=scalar;

    return *this;
  }